

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
reconstruct_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t *chunktable)

{
  _internal_exr_part *p_Var1;
  uint64_t *next_offset;
  long in_RDX;
  _internal_exr_part *in_RSI;
  _internal_exr_context *in_RDI;
  int ci_1;
  uint64_t unaff_retaddr;
  int ci;
  int partnum;
  int computed_ci;
  int found_ci;
  _internal_exr_part *curpart;
  uint64_t *curctable;
  uint64_t max_offset;
  uint64_t chunk_start;
  uint64_t offset_start;
  exr_result_t rv;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  _internal_exr_part *local_50;
  ulong *local_48;
  ulong local_40;
  ulong local_38;
  uint64_t *puVar2;
  uint in_stack_ffffffffffffffd8;
  exr_result_t eVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar3 = 0;
  local_5c = 0;
  next_offset = (uint64_t *)
                ((long)in_RDI->parts[in_RDI->num_parts + -1]->chunk_count * 8 +
                in_RDI->parts[in_RDI->num_parts + -1]->chunk_table_offset);
  local_50 = *in_RDI->parts;
  while (local_50 != in_RSI) {
    local_5c = local_5c + 1;
    local_50 = in_RDI->parts[local_5c];
  }
  local_40 = 0xffffffffffffffff;
  if (0 < in_RDI->file_size) {
    local_40 = in_RDI->file_size;
  }
  if (0 < local_5c) {
    p_Var1 = in_RDI->parts[local_5c + -1];
    eVar3 = extract_chunk_table((_internal_exr_context *)max_offset,(_internal_exr_part *)curctable,
                                (uint64_t **)curpart,(uint64_t *)_computed_ci);
    if (eVar3 != 0) {
      return eVar3;
    }
    local_38 = *local_48;
    for (local_60 = 1; local_60 < p_Var1->chunk_count; local_60 = local_60 + 1) {
      if (local_38 < local_48[local_60]) {
        local_38 = local_48[local_60];
      }
    }
    eVar3 = extract_chunk_size(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),
                               (ulong)in_stack_ffffffffffffffd8,next_offset);
    if (eVar3 != 0) {
      return eVar3;
    }
  }
  local_64 = 0;
  while( true ) {
    if (in_RSI->chunk_count <= local_64) {
      return eVar3;
    }
    puVar2 = next_offset;
    if ((next_offset <= *(uint64_t **)(in_RDX + (long)local_64 * 8)) &&
       (*(ulong *)(in_RDX + (long)local_64 * 8) < local_40)) {
      puVar2 = *(uint64_t **)(in_RDX + (long)local_64 * 8);
    }
    local_58 = local_64;
    if (in_RSI->lineorder == EXR_LINEORDER_DECREASING_Y) {
      local_58 = in_RSI->chunk_count - (local_64 + 1);
    }
    next_offset = puVar2;
    eVar3 = read_and_validate_chunk_leader
                      ((_internal_exr_context *)curpart,_computed_ci,partnum,unaff_retaddr,
                       (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (uint64_t *)in_RDI);
    if (eVar3 != 0) break;
    *(uint64_t **)(in_RDX + (long)local_58 * 8) = puVar2;
    local_64 = local_64 + 1;
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

static exr_result_t
reconstruct_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t*                           chunktable)
{
    exr_result_t                     rv = EXR_ERR_SUCCESS;
    uint64_t                         offset_start, chunk_start, max_offset;
    uint64_t*                        curctable;
    const struct _internal_exr_part* curpart = NULL;
    int                              found_ci, computed_ci, partnum = 0;

    curpart      = ctxt->parts[ctxt->num_parts - 1];
    offset_start = curpart->chunk_table_offset;
    offset_start += sizeof (uint64_t) * (uint64_t) curpart->chunk_count;

    curpart = ctxt->parts[partnum];
    while (curpart != part)
    {
        ++partnum;
        curpart = ctxt->parts[partnum];
    }

    max_offset = (uint64_t) -1;
    if (ctxt->file_size > 0) max_offset = (uint64_t) ctxt->file_size;

    // for multi-part, need to start at the first part and extract everything, then
    // work our way back up to this one, then grab the end of the previous part
    if (partnum > 0)
    {
        curpart = ctxt->parts[partnum - 1];
        rv      = extract_chunk_table (ctxt, curpart, &curctable, &chunk_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        chunk_start = curctable[0];
        for (int ci = 1; ci < curpart->chunk_count; ++ci)
        {
            if (curctable[ci] > chunk_start)
            {
                chunk_start = curctable[ci];
            }
        }

        rv = extract_chunk_size (
            ctxt, curpart, partnum - 1, chunk_start, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (int ci = 0; ci < part->chunk_count; ++ci)
    {
        if (chunktable[ci] >= offset_start && chunktable[ci] < max_offset)
        {
            offset_start = chunktable[ci];
        }
        chunk_start = offset_start;
        computed_ci = ci;
        if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
            computed_ci = part->chunk_count - (ci + 1);
        found_ci = computed_ci;
        rv       = read_and_validate_chunk_leader (
            ctxt, part, partnum, chunk_start, &found_ci, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        // scanlines can be more strict about the ordering
        if (part->storage_mode == EXR_STORAGE_SCANLINE ||
            part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (computed_ci != found_ci) return EXR_ERR_BAD_CHUNK_LEADER;
        }

        chunktable[found_ci] = chunk_start;
    }

    return rv;
}